

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.h
# Opt level: O2

QByteArray * QByteArray::fromRawData(QByteArray *__return_storage_ptr__,char *data,qsizetype size)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d = (Data *)0x0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  local_28.ptr = (char *)0x0;
  (__return_storage_ptr__->d).ptr = data;
  local_28.size = 0;
  (__return_storage_ptr__->d).size = size;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] static QByteArray fromRawData(const char *data, qsizetype size)
    {
        return QByteArray(DataPointer::fromRawData(data, size));
    }